

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a64emithelper.cpp
# Opt level: O1

Error __thiscall asmjit::v1_14::a64::EmitHelper::emitEpilog(EmitHelper *this,FuncFrame *frame)

{
  uint16_t uVar1;
  BaseEmitter *this_00;
  bool bVar2;
  Error EVar3;
  int iVar4;
  Error EVar5;
  Error EVar6;
  int iVar7;
  GroupData *pGVar8;
  Reg *pRVar9;
  LoadStoreInstructions *pLVar10;
  uint32_t uVar11;
  uint uVar12;
  int iVar13;
  ulong uVar14;
  uint32_t lo;
  RegGroup group;
  BaseEmitter *local_110;
  Operand_ local_108;
  uint32_t hi;
  Reg regs [2];
  PrologEpilogInfo pei;
  
  this_00 = (this->super_BaseEmitHelper)._emitter;
  EVar5 = PrologEpilogInfo::init(&pei,(EVP_PKEY_CTX *)frame);
  if (EVar5 != 0) {
    return EVar5;
  }
  uVar12 = frame->_stackAdjustment;
  EVar5 = 0;
  local_110 = this_00;
  if (uVar12 == 0) goto LAB_001378bd;
  if (uVar12 < 0x1000) {
LAB_00137838:
    regs[0].super_BaseReg.super_Operand.super_Operand_._data[1] = 0;
    regs[0].super_BaseReg.super_Operand.super_Operand_._data[0] = uVar12;
    regs[0].super_BaseReg.super_Operand.super_Operand_._signature._bits = 4;
    regs[0].super_BaseReg.super_Operand.super_Operand_._baseId = 0;
    EVar6 = EmitterExplicitT<asmjit::v1_14::a64::Emitter>::add
                      ((EmitterExplicitT<asmjit::v1_14::a64::Emitter> *)this_00,(Gp *)a64::regs::sp,
                       (Gp *)a64::regs::sp,(Imm *)regs);
    if (EVar6 != 0) goto LAB_001378b3;
    bVar2 = true;
  }
  else {
    if (uVar12 < 0x1000000) {
      regs[0].super_BaseReg.super_Operand.super_Operand_._signature._bits = 4;
      regs[0].super_BaseReg.super_Operand.super_Operand_._baseId = 0;
      regs[0].super_BaseReg.super_Operand.super_Operand_._data[1] = 0;
      regs[0].super_BaseReg.super_Operand.super_Operand_._data[0] = uVar12 & 0xfff;
      EVar6 = EmitterExplicitT<asmjit::v1_14::a64::Emitter>::add
                        ((EmitterExplicitT<asmjit::v1_14::a64::Emitter> *)this_00,
                         (Gp *)a64::regs::sp,(Gp *)a64::regs::sp,(Imm *)regs);
      if (EVar6 == 0) {
        uVar12 = uVar12 & 0xfff000;
        goto LAB_00137838;
      }
    }
    else {
      EVar6 = 3;
    }
LAB_001378b3:
    EVar5 = EVar6;
    bVar2 = false;
  }
  if (!bVar2) {
    return EVar5;
  }
LAB_001378bd:
  hi = (int)pei.sizeTotal >> 0x1f;
  iVar4 = 1;
  do {
    iVar7 = iVar4;
    if (iVar7 < 0) break;
    group = (RegGroup)iVar7;
    pGVar8 = Support::Array<asmjit::v1_14::a64::PrologEpilogInfo::GroupData,_2UL>::
             operator[]<asmjit::v1_14::RegGroup>(&pei.groups,&group);
    uVar14 = (ulong)pGVar8->pairCount;
    pRVar9 = Support::Array<asmjit::v1_14::arm::Reg,_2UL>::operator[]<asmjit::v1_14::RegGroup>
                       (&emitEpilog::groupRegs,&group);
    regs[0].super_BaseReg.super_Operand.super_Operand_._signature._bits =
         (pRVar9->super_BaseReg).super_Operand.super_Operand_._signature._bits;
    regs[0].super_BaseReg.super_Operand.super_Operand_._baseId =
         (pRVar9->super_BaseReg).super_Operand.super_Operand_._baseId;
    regs[0].super_BaseReg.super_Operand.super_Operand_._data =
         *&(pRVar9->super_BaseReg).super_Operand.super_Operand_._data;
    pRVar9 = Support::Array<asmjit::v1_14::arm::Reg,_2UL>::operator[]<asmjit::v1_14::RegGroup>
                       (&emitEpilog::groupRegs,&group);
    regs[1].super_BaseReg.super_Operand.super_Operand_._signature._bits =
         (pRVar9->super_BaseReg).super_Operand.super_Operand_._signature._bits;
    regs[1].super_BaseReg.super_Operand.super_Operand_._baseId =
         (pRVar9->super_BaseReg).super_Operand.super_Operand_._baseId;
    regs[1].super_BaseReg.super_Operand.super_Operand_._data =
         *&(pRVar9->super_BaseReg).super_Operand.super_Operand_._data;
    local_108._signature._bits = 0x3a;
    local_108._baseId = 0x1f;
    local_108._data[0] = 0;
    local_108._data[1] = 0;
    pLVar10 = Support::Array<asmjit::v1_14::a64::LoadStoreInstructions,_2UL>::
              operator[]<asmjit::v1_14::RegGroup>(&emitEpilog::groupInsts,&group);
    do {
      iVar13 = (int)uVar14;
      if (iVar13 < 1) break;
      regs[0].super_BaseReg.super_Operand.super_Operand_._baseId._0_1_ =
           pGVar8->pairs[uVar14 - 1].ids[0];
      regs[0].super_BaseReg.super_Operand.super_Operand_._baseId._1_3_ = 0;
      regs[1].super_BaseReg.super_Operand.super_Operand_._baseId._0_1_ =
           pGVar8->pairs[uVar14 - 1].ids[1];
      regs[1].super_BaseReg.super_Operand.super_Operand_._baseId._1_3_ = 0;
      uVar1 = pGVar8->pairs[uVar14 - 1].offset;
      local_108._data[1]._0_2_ = uVar1;
      local_108._data[1]._2_2_ = 0;
      if (uVar1 == 0 && pei.sizeTotal != 0) {
        local_108._data[1] = pei.sizeTotal;
        uVar11 = hi;
        if ((local_108._0_8_ & 0xf8) != 0) {
          uVar11 = local_108._baseId;
        }
        local_108._0_8_ =
             CONCAT44(uVar11,local_108._signature._bits) & 0xfffffffffcffffff | 0x2000000;
      }
      if (pGVar8->pairs[uVar14 - 1].ids[1] == 0xff) {
        EVar6 = BaseEmitter::_emitI(local_110,pLVar10->singleInstId,(Operand_ *)regs,&local_108);
      }
      else {
        EVar6 = BaseEmitter::_emitI(local_110,pLVar10->pairInstId,(Operand_ *)regs,
                                    (Operand_ *)(regs + 1),&local_108);
      }
      EVar3 = EVar6;
      if (EVar6 == 0) {
        local_108._0_8_ = local_108._0_8_ & 0xfffffffffcffffff;
        EVar3 = EVar5;
      }
      EVar5 = EVar3;
      uVar14 = uVar14 - 1;
    } while (EVar6 == 0);
    iVar4 = iVar7 + -1;
  } while (iVar13 < 1);
  if (iVar7 < 0) {
    EVar5 = EmitterExplicitT<asmjit::v1_14::a64::Emitter>::ret
                      ((EmitterExplicitT<asmjit::v1_14::a64::Emitter> *)local_110,
                       (Gp *)a64::regs::x30);
  }
  return EVar5;
}

Assistant:

ASMJIT_FAVOR_SIZE Error EmitHelper::emitEpilog(const FuncFrame& frame) {
  Emitter* emitter = _emitter->as<Emitter>();

  PrologEpilogInfo pei;
  ASMJIT_PROPAGATE(pei.init(frame));

  static const Support::Array<Reg, 2> groupRegs = {{ x0, d0 }};
  static const Support::Array<LoadStoreInstructions, 2> groupInsts = {{
    { Inst::kIdLdr  , Inst::kIdLdp   },
    { Inst::kIdLdr_v, Inst::kIdLdp_v }
  }};

  uint32_t adjustInitialOffset = pei.sizeTotal;

  if (frame.hasStackAdjustment()) {
    uint32_t adj = frame.stackAdjustment();
    if (adj <= 0xFFFu) {
      ASMJIT_PROPAGATE(emitter->add(sp, sp, adj));
    }
    else if (adj <= 0xFFFFFFu)  {
      ASMJIT_PROPAGATE(emitter->add(sp, sp, adj & 0x000FFFu));
      ASMJIT_PROPAGATE(emitter->add(sp, sp, adj & 0xFFF000u));
    }
    else {
      return DebugUtils::errored(kErrorInvalidState);
    }
  }

  for (int g = 1; g >= 0; g--) {
    RegGroup group = RegGroup(g);
    const PrologEpilogInfo::GroupData& data = pei.groups[group];
    uint32_t pairCount = data.pairCount;

    Reg regs[2] = { groupRegs[group], groupRegs[group] };
    Mem mem = ptr(sp);

    const LoadStoreInstructions& insts = groupInsts[group];

    for (int i = int(pairCount) - 1; i >= 0; i--) {
      const PrologEpilogInfo::RegPair& pair = data.pairs[i];

      regs[0].setId(pair.ids[0]);
      regs[1].setId(pair.ids[1]);
      mem.setOffsetLo32(pair.offset);

      if (pair.offset == 0 && adjustInitialOffset) {
        mem.setOffset(int(adjustInitialOffset));
        mem.makePostIndex();
      }

      if (pair.ids[1] == BaseReg::kIdBad)
        ASMJIT_PROPAGATE(emitter->emit(insts.singleInstId, regs[0], mem));
      else
        ASMJIT_PROPAGATE(emitter->emit(insts.pairInstId, regs[0], regs[1], mem));

      mem.resetOffsetMode();
    }
  }

  ASMJIT_PROPAGATE(emitter->ret(x30));

  return kErrorOk;
}